

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void ignorableWhitespaceSplit(void *ctx,xmlChar *ch,int len)

{
  xmlSchemaSAXPlugPtr ctxt;
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if ((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x90) != 0))
    {
      (**(code **)(*(long *)((long)ctx + 0x10) + 0x90))(*(undefined8 *)((long)ctx + 0x20),ch,len);
    }
    if (*(long *)((long)ctx + 0x128) != 0) {
      xmlSchemaSAXHandleText(*(void **)((long)ctx + 0x128),ch,len);
    }
  }
  return;
}

Assistant:

static void
ignorableWhitespaceSplit(void *ctx, const xmlChar *ch, int len)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if (ctxt == NULL)
        return;
    if ((ctxt->user_sax != NULL) &&
        (ctxt->user_sax->ignorableWhitespace != NULL))
	ctxt->user_sax->ignorableWhitespace(ctxt->user_data, ch, len);
    if (ctxt->ctxt != NULL)
	xmlSchemaSAXHandleText(ctxt->ctxt, ch, len);
}